

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

void deqp::gls::checkImplementationLimits
               (vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                *requiredCaps,ContextInfo *ctxInfo)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  NotSupportedError *this;
  Enum<int,_2UL> EVar4;
  string local_160;
  string local_140;
  GetNameFunc local_120;
  int local_118;
  GetNameFunc local_100;
  int local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  int local_28;
  int supportedValue;
  int requiredValue;
  deUint32 pname;
  size_t capNdx;
  ContextInfo *ctxInfo_local;
  vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
  *requiredCaps_local;
  
  _requiredValue = 0;
  capNdx = (size_t)ctxInfo;
  ctxInfo_local = (ContextInfo *)requiredCaps;
  while( true ) {
    uVar1 = _requiredValue;
    sVar2 = std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
            size((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                  *)ctxInfo_local);
    if (sVar2 <= uVar1) {
      return;
    }
    pvVar3 = std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
             ::operator[]((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                           *)ctxInfo_local,_requiredValue);
    supportedValue = pvVar3->enumName;
    pvVar3 = std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
             ::operator[]((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                           *)ctxInfo_local,_requiredValue);
    local_28 = pvVar3->referenceValue;
    local_2c = (**(code **)(*(long *)capNdx + 0x10))(capNdx,supportedValue);
    if (local_2c <= local_28) break;
    _requiredValue = _requiredValue + 1;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  EVar4 = glu::getGettableStateStr(supportedValue);
  local_120 = EVar4.m_getName;
  local_118 = EVar4.m_value;
  local_100 = local_120;
  local_f8 = local_118;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_f0,(de *)&local_100,EVar4._8_8_);
  std::operator+(&local_d0,"Test requires ",&local_f0);
  std::operator+(&local_b0,&local_d0," (");
  de::toString<int>(&local_140,&local_2c);
  std::operator+(&local_90,&local_b0,&local_140);
  std::operator+(&local_70,&local_90,") >= ");
  de::toString<int>(&local_160,&local_28);
  std::operator+(&local_50,&local_70,&local_160);
  tcu::NotSupportedError::NotSupportedError(this,&local_50);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

static void checkImplementationLimits (const vector<RequiredCapability>&	requiredCaps,
									   const ContextInfo&					ctxInfo)
{
	for (size_t capNdx = 0; capNdx < requiredCaps.size(); ++capNdx)
	{
		const deUint32	pname			= requiredCaps[capNdx].enumName;
		const int		requiredValue	= requiredCaps[capNdx].referenceValue;
		const int		supportedValue	= ctxInfo.getInt((int)pname);

		if (supportedValue <= requiredValue)
			throw tcu::NotSupportedError("Test requires " + de::toString(glu::getGettableStateStr(pname)) + " (" + de::toString(supportedValue) + ") >= " + de::toString(requiredValue));
	}
}